

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

_Bool normalize_forward_slash(char *path,char *dest)

{
  _Bool _Var1;
  char *in_RSI;
  char *in_RDI;
  size_t step;
  char *q;
  char *p;
  size_t local_30;
  char *local_28;
  char *local_20;
  _Bool local_1;
  
  if ((in_RDI == (char *)0x0) || (in_RSI == (char *)0x0)) {
    local_1 = false;
  }
  else {
    _Var1 = has_driveletter(in_RDI);
    local_28 = in_RSI;
    local_20 = in_RDI;
    if (_Var1) {
      *in_RSI = *in_RDI;
      local_20 = in_RDI + 2;
      local_28 = in_RSI + 2;
      in_RSI[1] = in_RDI[1];
    }
    if ((*local_20 == *G_BACKSLASH_CHAR) || (*local_20 == *G_FORWARD_SLASH_CHAR)) {
      local_20 = local_20 + 1;
      *local_28 = *G_FORWARD_SLASH_CHAR;
      local_28 = local_28 + 1;
    }
    while (*local_20 != '\0') {
      local_30 = GetUTF8Length(*local_20);
      if (local_30 < 2) {
        if ((*local_20 == *G_BACKSLASH_CHAR) || (*local_20 == *G_FORWARD_SLASH_CHAR)) {
          *local_28 = *G_FORWARD_SLASH_CHAR;
        }
        else {
          *local_28 = *local_20;
        }
        local_20 = local_20 + 1;
        local_28 = local_28 + 1;
      }
      else {
        while (local_30 != 0) {
          *local_28 = *local_20;
          local_30 = local_30 - 1;
          local_28 = local_28 + 1;
          local_20 = local_20 + 1;
        }
      }
    }
    *local_28 = '\0';
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool normalize_forward_slash(const char *path, char *dest)
{
	if (path == NULL || dest == NULL)
	{
		return false;
	}

	const char *p = path;
	char *q = dest;
	if (has_driveletter(path))
	{
		*q++ = *p++;
		*q++ = *p++;
	}
	if ((*p == *G_BACKSLASH_CHAR) || (*p == *G_FORWARD_SLASH_CHAR))
	{
		p++;
		*q++ = *G_FORWARD_SLASH_CHAR;
	}

	while (*p)
	{
		size_t step = GetUTF8Length(*p);
		if (step > 1)
		{
			while (step--)
			{
				*q++ = *p++;
			}
		}
		else if ((*p == *G_BACKSLASH_CHAR) || (*p == *G_FORWARD_SLASH_CHAR))
		{
			p++;
			*q++ = *G_FORWARD_SLASH_CHAR;
		}
		else
		{
			*q++ = *p++;
		}
	}
	*q = '\0';

	return true;
}